

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_monte_carlo.cpp
# Opt level: O0

double * line01_sample_ergodic(int n,double *shift)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double *x;
  int j;
  double golden;
  double *shift_local;
  int n_local;
  
  dVar4 = sqrt(5.0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  dVar5 = fmod(*shift,1.0);
  *shift = dVar5;
  for (x._4_4_ = 0; x._4_4_ < n; x._4_4_ = x._4_4_ + 1) {
    pdVar3[x._4_4_] = *shift;
    dVar5 = fmod(*shift + (dVar4 + 1.0) / 2.0,1.0);
    *shift = dVar5;
  }
  return pdVar3;
}

Assistant:

double *line01_sample_ergodic ( int n, double &shift )

//****************************************************************************80
//
//  Purpose:
//
//    LINE01_SAMPLE_ERGODIC samples the unit line in 1D.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 June 2017
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of points.
//
//    Input/output, double &SHIFT, a value between 0 and 1.
//
//    Output, double X[N], the points.
//
{
  double golden;
  int j;
  double *x;

  golden = ( 1.0 + sqrt ( 5.0 ) ) / 2.0;

  x = new double[n];

  shift = fmod ( shift, 1.0 );

  for ( j = 0; j < n; j++ )
  {
    x[j] = shift;
    shift = fmod ( shift + golden, 1.0 );
  }

  return x;
}